

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * __thiscall
Lowerer::GenerateArgOutForInlineeStackArgs(Lowerer *this,Instr *callInstr,Instr *stackArgsInstr)

{
  ushort uVar1;
  Func *this_00;
  StackSym *stackSym;
  Func *func;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  RegOpnd *dst;
  IndirOpnd *this_01;
  Instr *instr;
  IntConstOpnd *pIVar7;
  int offset;
  uint argNumber;
  undefined1 local_88 [8];
  AutoReuseOpnd autoReuseFirstArg;
  AutoReuseOpnd autoReuseArgInOpnd;
  
  bVar3 = Func::IsInlinee(callInstr->m_func);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x548c,"(callInstr->m_func->IsInlinee())","callInstr->m_func->IsInlinee()");
    if (!bVar3) goto LAB_005e3ed6;
    *puVar5 = 0;
  }
  this_00 = callInstr->m_func;
  uVar1 = this_00->actualCount;
  if (0xe < uVar1 - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x548f,"(actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                       "actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount");
    if (!bVar3) goto LAB_005e3ed6;
    *puVar5 = 0;
  }
  pSVar6 = Func::GetInlineeArgvSlotOpnd(this_00);
  stackSym = (StackSym *)pSVar6->m_sym;
  if ((stackSym->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) {
LAB_005e3ed6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  pSVar6 = IR::SymOpnd::New((Sym *)stackSym,TyUint64,this_00);
  local_88 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_88,&pSVar6->super_Opnd,this_00,true);
  dst = IR::RegOpnd::New(TyInt64,this_00);
  autoReuseFirstArg.autoDelete = false;
  autoReuseFirstArg.wasInUse = false;
  autoReuseFirstArg._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete,&dst->super_Opnd,this_00,true);
  InsertLea(dst,&pSVar6->super_Opnd,callInstr);
  if (uVar1 != 1) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    offset = (uint)uVar1 * 8 + -0x10;
    argNumber = uVar1 + 2;
    do {
      this_01 = IR::IndirOpnd::New(dst,offset,TyInt64,this_00,false);
      instr = IR::Instr::New(ArgOut_A_Dynamic,this_00);
      if (instr->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar3) goto LAB_005e3ed6;
        *puVar5 = 0;
      }
      func = instr->m_func;
      if ((this_01->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar3) goto LAB_005e3ed6;
        *puVar5 = 0;
      }
      bVar4 = (this_01->super_Opnd).field_0xb;
      if ((bVar4 & 2) != 0) {
        this_01 = (IndirOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
        bVar4 = (this_01->super_Opnd).field_0xb;
      }
      (this_01->super_Opnd).field_0xb = bVar4 | 2;
      instr->m_src1 = &this_01->super_Opnd;
      IR::Instr::InsertBefore(callInstr,instr);
      LowererMDArch::LoadDynamicArgument(&(this->m_lowererMD).lowererMDArch,instr,argNumber);
      offset = offset + -8;
      argNumber = argNumber - 1;
    } while (argNumber != 3);
  }
  pIVar7 = IR::IntConstOpnd::New((ulong)this_00->actualCount,TyInt64,this_00,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
  return &pIVar7->super_Opnd;
}

Assistant:

IR::Opnd*
Lowerer::GenerateArgOutForInlineeStackArgs(IR::Instr* callInstr, IR::Instr* stackArgsInstr)
{
    Assert(callInstr->m_func->IsInlinee());
    Func *func = callInstr->m_func;
    uint32 actualCount = func->actualCount - 1; // don't count this pointer
    Assert(actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount);

    const auto firstRealArgStackSym = func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
    this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr); //Start after this pointer
    IR::SymOpnd *firstArg = IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseFirstArg(firstArg, func);
    IR::RegOpnd* argInOpnd = IR::RegOpnd::New(TyMachReg, func);
    const IR::AutoReuseOpnd autoReuseArgInOpnd(argInOpnd, func);
    InsertLea(argInOpnd, firstArg, callInstr);

    IR::IndirOpnd *argIndirOpnd = nullptr;
    IR::Instr* argout = nullptr;

#if defined(_M_IX86)
    // Maintain alignment
    if ((actualCount & 1) == 0)
    {
        IR::Instr *alignPush = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
        alignPush->SetSrc1(IR::IntConstOpnd::New(1, TyInt32, this->m_func));
        callInstr->InsertBefore(alignPush);
    }
#endif

    for(uint i = actualCount; i > 0; i--)
    {
        argIndirOpnd = IR::IndirOpnd::New(argInOpnd, (i - 1) * MachPtr, TyMachReg, func);
        argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
        argout->SetSrc1(argIndirOpnd);
        callInstr->InsertBefore(argout);
        // i represents ith arguments from actuals, with is i + 3 counting this, callInfo and function object
        this->m_lowererMD.LoadDynamicArgument(argout, i + 3);
    }
    return IR::IntConstOpnd::New(func->actualCount, TyMachReg, func);
}